

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_wiener_convolve_avx2.c
# Opt level: O3

void av1_highbd_wiener_convolve_add_src_avx2
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  byte bVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined1 *puVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined4 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 local_8760 [1792];
  undefined1 local_8060 [32816];
  undefined1 auVar25 [64];
  
  uVar1 = conv_params->round_0;
  bVar7 = (byte)bd;
  if (-7 < h) {
    lVar9 = (long)src8 * 2 + src_stride * -6;
    auVar15._0_2_ = ~(ushort)(-1 << ((bVar7 - (char)uVar1) + 8 & 0x1f));
    auVar15._2_2_ = auVar15._0_2_;
    auVar15._4_2_ = auVar15._0_2_;
    auVar15._6_2_ = auVar15._0_2_;
    auVar15._8_2_ = auVar15._0_2_;
    auVar15._10_2_ = auVar15._0_2_;
    auVar15._12_2_ = auVar15._0_2_;
    auVar15._14_2_ = auVar15._0_2_;
    auVar15._16_2_ = auVar15._0_2_;
    auVar15._18_2_ = auVar15._0_2_;
    auVar15._20_2_ = auVar15._0_2_;
    auVar15._22_2_ = auVar15._0_2_;
    auVar15._24_2_ = auVar15._0_2_;
    auVar15._26_2_ = auVar15._0_2_;
    auVar15._28_2_ = auVar15._0_2_;
    auVar15._30_2_ = auVar15._0_2_;
    iVar11 = (1 << ((char)uVar1 - 1U & 0x1f)) + (1 << (bVar7 + 6 & 0x1f));
    auVar16._4_4_ = iVar11;
    auVar16._0_4_ = iVar11;
    auVar16._8_4_ = iVar11;
    auVar16._12_4_ = iVar11;
    auVar16._16_4_ = iVar11;
    auVar16._20_4_ = iVar11;
    auVar16._24_4_ = iVar11;
    auVar16._28_4_ = iVar11;
    auVar2 = vpaddw_avx(*(undefined1 (*) [16])filter_x,_DAT_00d96730);
    auVar3 = vpshufd_avx(auVar2,0xff);
    auVar18._0_8_ = auVar3._0_8_;
    auVar18._8_8_ = auVar18._0_8_;
    auVar18._16_8_ = auVar18._0_8_;
    auVar18._24_8_ = auVar18._0_8_;
    auVar3 = vpshufd_avx(auVar2,0xfa);
    auVar19._0_8_ = auVar3._0_8_;
    auVar19._8_8_ = auVar19._0_8_;
    auVar19._16_8_ = auVar19._0_8_;
    auVar19._24_8_ = auVar19._0_8_;
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar20._0_8_ = auVar3._0_8_;
    auVar20._8_8_ = auVar20._0_8_;
    auVar20._16_8_ = auVar20._0_8_;
    auVar20._24_8_ = auVar20._0_8_;
    auVar21._0_4_ = auVar2._0_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    auVar21._16_4_ = auVar21._0_4_;
    auVar21._20_4_ = auVar21._0_4_;
    auVar21._24_4_ = auVar21._0_4_;
    auVar21._28_4_ = auVar21._0_4_;
    iVar11 = h + 6;
    uVar10 = 0;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    puVar13 = local_8760;
    do {
      if (0 < w) {
        lVar12 = 0;
        do {
          auVar24 = vpmaddwd_avx2(auVar21,*(undefined1 (*) [32])(lVar9 + -6 + lVar12 * 2));
          auVar26 = vpmaddwd_avx2(auVar21,*(undefined1 (*) [32])(lVar9 + -4 + lVar12 * 2));
          auVar28 = vpmaddwd_avx2(auVar20,*(undefined1 (*) [32])(lVar9 + -2 + lVar12 * 2));
          auVar29 = vpmaddwd_avx2(auVar20,*(undefined1 (*) [32])(lVar9 + lVar12 * 2));
          auVar4 = vpmaddwd_avx2(auVar19,*(undefined1 (*) [32])(lVar9 + 2 + lVar12 * 2));
          auVar5 = vpmaddwd_avx2(auVar19,*(undefined1 (*) [32])(lVar9 + 4 + lVar12 * 2));
          auVar6 = vpmaddwd_avx2(auVar18,*(undefined1 (*) [32])(lVar9 + 6 + lVar12 * 2));
          auVar28 = vpaddd_avx2(auVar28,auVar4);
          auVar4 = vpmaddwd_avx2(auVar18,*(undefined1 (*) [32])(lVar9 + 8 + lVar12 * 2));
          auVar24 = vpaddd_avx2(auVar24,auVar16);
          auVar28 = vpaddd_avx2(auVar24,auVar28);
          auVar28 = vpaddd_avx2(auVar28,auVar6);
          auVar6 = vpsrad_avx2(auVar28,ZEXT416(uVar1));
          auVar28 = vpaddd_avx2(auVar29,auVar5);
          auVar24 = vpaddd_avx2(auVar26,auVar16);
          auVar28 = vpaddd_avx2(auVar24,auVar28);
          auVar28 = vpaddd_avx2(auVar28,auVar4);
          auVar28 = vpsrad_avx2(auVar28,ZEXT416(uVar1));
          auVar28 = vpackssdw_avx2(auVar6,auVar28);
          auVar28 = vpmaxsw_avx2(auVar28,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar28 = vpminsw_avx2(auVar28,auVar15);
          *(undefined1 (*) [32])(puVar13 + lVar12 * 2) = auVar28;
          lVar12 = lVar12 + 0x10;
        } while (lVar12 < w);
      }
      uVar10 = uVar10 + 1;
      puVar13 = puVar13 + 0x100;
      lVar9 = lVar9 + src_stride * 2;
    } while (uVar10 != iVar11 + 1);
  }
  cVar8 = (char)conv_params->round_1;
  if (0 < h) {
    lVar9 = (long)dst8 * 2;
    uVar14 = ~(ushort)(-1 << (bVar7 & 0x1f));
    iVar11 = (-1 << ((cVar8 + bVar7) - 1 & 0x1f)) + (1 << (cVar8 - 1U & 0x1f));
    auVar27 = ZEXT3264(CONCAT428(iVar11,CONCAT424(iVar11,CONCAT420(iVar11,CONCAT416(iVar11,CONCAT412
                                                  (iVar11,CONCAT48(iVar11,CONCAT44(iVar11,iVar11))))
                                                  ))));
    auVar2 = vpaddw_avx(*(undefined1 (*) [16])filter_y,_DAT_00d96730);
    auVar3 = vpshufd_avx(auVar2,0xff);
    uVar17 = auVar3._0_8_;
    auVar28._8_8_ = uVar17;
    auVar28._0_8_ = uVar17;
    auVar28._16_8_ = uVar17;
    auVar28._24_8_ = uVar17;
    auVar3 = vpshufd_avx(auVar2,0xfa);
    uVar17 = auVar3._0_8_;
    auVar30 = ZEXT3264(CONCAT824(uVar17,CONCAT816(uVar17,CONCAT88(uVar17,uVar17))));
    auVar3 = vpshufd_avx(auVar2,0x55);
    uVar17 = auVar3._0_8_;
    auVar22 = ZEXT3264(CONCAT824(uVar17,CONCAT816(uVar17,CONCAT88(uVar17,uVar17))));
    uVar23 = auVar2._0_4_;
    auVar25 = ZEXT3264(CONCAT428(uVar23,CONCAT424(uVar23,CONCAT420(uVar23,CONCAT416(uVar23,CONCAT412
                                                  (uVar23,CONCAT48(uVar23,CONCAT44(uVar23,uVar23))))
                                                  ))));
    puVar13 = local_8060;
    uVar10 = 0;
    do {
      if (0 < w) {
        lVar12 = 0;
        do {
          auVar26 = auVar27._0_32_;
          auVar24 = auVar25._0_32_;
          auVar21 = auVar22._0_32_;
          auVar29 = auVar30._0_32_;
          auVar15 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x700),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x600));
          auVar16 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x500),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x400));
          auVar18 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x300),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x200));
          auVar15 = vpmaddwd_avx2(auVar15,auVar24);
          auVar16 = vpmaddwd_avx2(auVar16,auVar21);
          auVar15 = vpaddd_avx2(auVar15,auVar16);
          auVar19 = vpunpcklwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x100),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2));
          auVar16 = vpmaddwd_avx2(auVar18,auVar29);
          auVar18 = vpmaddwd_avx2(auVar19,auVar28);
          auVar16 = vpaddd_avx2(auVar18,auVar16);
          auVar15 = vpaddd_avx2(auVar15,auVar16);
          auVar16 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x700),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x600));
          auVar18 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x500),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x400));
          auVar30 = ZEXT3264(auVar29);
          auVar22 = ZEXT3264(auVar21);
          auVar25 = ZEXT3264(auVar24);
          auVar19 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x300),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x200));
          auVar20 = vpunpckhwd_avx2(*(undefined1 (*) [32])(puVar13 + lVar12 * 2 + -0x100),
                                    *(undefined1 (*) [32])(puVar13 + lVar12 * 2));
          auVar16 = vpmaddwd_avx2(auVar16,auVar24);
          auVar18 = vpmaddwd_avx2(auVar18,auVar21);
          auVar16 = vpaddd_avx2(auVar18,auVar16);
          auVar18 = vpmaddwd_avx2(auVar19,auVar29);
          auVar19 = vpmaddwd_avx2(auVar28,auVar20);
          auVar18 = vpaddd_avx2(auVar19,auVar18);
          auVar27 = ZEXT3264(auVar26);
          auVar16 = vpaddd_avx2(auVar16,auVar18);
          auVar19 = vpunpckldq_avx2(auVar15,auVar16);
          auVar18 = vpunpckhdq_avx2(auVar15,auVar16);
          auVar15 = vpaddd_avx2(auVar19,auVar26);
          auVar16 = vpsrad_avx2(auVar15,ZEXT416((uint)conv_params->round_1));
          auVar15 = vpaddd_avx2(auVar18,auVar26);
          auVar15 = vpsrad_avx2(auVar15,ZEXT416((uint)conv_params->round_1));
          auVar15 = vpackssdw_avx2(auVar16,auVar15);
          auVar24._2_2_ = uVar14;
          auVar24._0_2_ = uVar14;
          auVar24._4_2_ = uVar14;
          auVar24._6_2_ = uVar14;
          auVar24._8_2_ = uVar14;
          auVar24._10_2_ = uVar14;
          auVar24._12_2_ = uVar14;
          auVar24._14_2_ = uVar14;
          auVar24._16_2_ = uVar14;
          auVar24._18_2_ = uVar14;
          auVar24._20_2_ = uVar14;
          auVar24._22_2_ = uVar14;
          auVar24._24_2_ = uVar14;
          auVar24._26_2_ = uVar14;
          auVar24._28_2_ = uVar14;
          auVar24._30_2_ = uVar14;
          auVar15 = vpmaxsw_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar15 = vpminsw_avx2(auVar15,auVar24);
          *(undefined1 (*) [32])(lVar9 + lVar12 * 2) = auVar15;
          lVar12 = lVar12 + 0x10;
        } while (lVar12 < w);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + dst_stride * 2;
      puVar13 = puVar13 + 0x100;
    } while (uVar10 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_avx2(
    const uint8_t *src8, ptrdiff_t src_stride, uint8_t *dst8,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);
  (void)x_step_q4;
  (void)y_step_q4;

  const uint16_t *const src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *const dst = CONVERT_TO_SHORTPTR(dst8);

  DECLARE_ALIGNED(32, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 1;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint16_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero_128 = _mm_setzero_si128();
  const __m256i zero_256 = _mm256_setzero_si256();

  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero_128, 1 << FILTER_BITS, 3);

  const __m256i clamp_low = zero_256;

  /* Horizontal filter */
  {
    const __m256i clamp_high_ep =
        _mm256_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1);

    // coeffs [ f7 f6 f5 f4 f3 f2 f1 f0 ]
    const __m128i coeffs_x = _mm_add_epi16(xx_loadu_128(filter_x), offset);

    // coeffs [ f3 f2 f3 f2 f1 f0 f1 f0 ]
    const __m128i coeffs_0123 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs [ f7 f6 f7 f6 f5 f4 f5 f4 ]
    const __m128i coeffs_4567 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m128i coeffs_01_128 = _mm_unpacklo_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m128i coeffs_23_128 = _mm_unpackhi_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m128i coeffs_45_128 = _mm_unpacklo_epi64(coeffs_4567, coeffs_4567);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m128i coeffs_67_128 = _mm_unpackhi_epi64(coeffs_4567, coeffs_4567);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ][ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m256i coeffs_01 = yy_set_m128i(coeffs_01_128, coeffs_01_128);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ][ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m256i coeffs_23 = yy_set_m128i(coeffs_23_128, coeffs_23_128);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ][ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m256i coeffs_45 = yy_set_m128i(coeffs_45_128, coeffs_45_128);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ][ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m256i coeffs_67 = yy_set_m128i(coeffs_67_128, coeffs_67_128);

    const __m256i round_const = _mm256_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (int i = 0; i < intermediate_height; ++i) {
      for (int j = 0; j < w; j += 16) {
        const uint16_t *src_ij = src_ptr + i * src_stride + j;

        // Load 16-bit src data
        const __m256i src_0 = yy_loadu_256(src_ij + 0);
        const __m256i src_1 = yy_loadu_256(src_ij + 1);
        const __m256i src_2 = yy_loadu_256(src_ij + 2);
        const __m256i src_3 = yy_loadu_256(src_ij + 3);
        const __m256i src_4 = yy_loadu_256(src_ij + 4);
        const __m256i src_5 = yy_loadu_256(src_ij + 5);
        const __m256i src_6 = yy_loadu_256(src_ij + 6);
        const __m256i src_7 = yy_loadu_256(src_ij + 7);

        // Multiply src data by filter coeffs and sum pairs
        const __m256i res_0 = _mm256_madd_epi16(src_0, coeffs_01);
        const __m256i res_1 = _mm256_madd_epi16(src_1, coeffs_01);
        const __m256i res_2 = _mm256_madd_epi16(src_2, coeffs_23);
        const __m256i res_3 = _mm256_madd_epi16(src_3, coeffs_23);
        const __m256i res_4 = _mm256_madd_epi16(src_4, coeffs_45);
        const __m256i res_5 = _mm256_madd_epi16(src_5, coeffs_45);
        const __m256i res_6 = _mm256_madd_epi16(src_6, coeffs_67);
        const __m256i res_7 = _mm256_madd_epi16(src_7, coeffs_67);

        // Calculate scalar product for even- and odd-indices separately,
        // increasing to 32-bit precision
        const __m256i res_even_sum = _mm256_add_epi32(
            _mm256_add_epi32(res_0, res_4), _mm256_add_epi32(res_2, res_6));
        const __m256i res_even = _mm256_srai_epi32(
            _mm256_add_epi32(res_even_sum, round_const), conv_params->round_0);

        const __m256i res_odd_sum = _mm256_add_epi32(
            _mm256_add_epi32(res_1, res_5), _mm256_add_epi32(res_3, res_7));
        const __m256i res_odd = _mm256_srai_epi32(
            _mm256_add_epi32(res_odd_sum, round_const), conv_params->round_0);

        // Reduce to 16-bit precision and pack even- and odd-index results
        // back into one register. The _mm256_packs_epi32 intrinsic returns
        // a register with the pixels ordered as follows:
        // [ 15 13 11 9 14 12 10 8 ] [ 7 5 3 1 6 4 2 0 ]
        const __m256i res = _mm256_packs_epi32(res_even, res_odd);
        const __m256i res_clamped =
            _mm256_min_epi16(_mm256_max_epi16(res, clamp_low), clamp_high_ep);

        // Store in a temporary array
        yy_storeu_256(temp + i * MAX_SB_SIZE + j, res_clamped);
      }
    }
  }

  /* Vertical filter */
  {
    const __m256i clamp_high = _mm256_set1_epi16((1 << bd) - 1);

    // coeffs [ f7 f6 f5 f4 f3 f2 f1 f0 ]
    const __m128i coeffs_y = _mm_add_epi16(xx_loadu_128(filter_y), offset);

    // coeffs [ f3 f2 f3 f2 f1 f0 f1 f0 ]
    const __m128i coeffs_0123 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs [ f7 f6 f7 f6 f5 f4 f5 f4 ]
    const __m128i coeffs_4567 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m128i coeffs_01_128 = _mm_unpacklo_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m128i coeffs_23_128 = _mm_unpackhi_epi64(coeffs_0123, coeffs_0123);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m128i coeffs_45_128 = _mm_unpacklo_epi64(coeffs_4567, coeffs_4567);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m128i coeffs_67_128 = _mm_unpackhi_epi64(coeffs_4567, coeffs_4567);

    // coeffs [ f1 f0 f1 f0 f1 f0 f1 f0 ][ f1 f0 f1 f0 f1 f0 f1 f0 ]
    const __m256i coeffs_01 = yy_set_m128i(coeffs_01_128, coeffs_01_128);
    // coeffs [ f3 f2 f3 f2 f3 f2 f3 f2 ][ f3 f2 f3 f2 f3 f2 f3 f2 ]
    const __m256i coeffs_23 = yy_set_m128i(coeffs_23_128, coeffs_23_128);
    // coeffs [ f5 f4 f5 f4 f5 f4 f5 f4 ][ f5 f4 f5 f4 f5 f4 f5 f4 ]
    const __m256i coeffs_45 = yy_set_m128i(coeffs_45_128, coeffs_45_128);
    // coeffs [ f7 f6 f7 f6 f7 f6 f7 f6 ][ f7 f6 f7 f6 f7 f6 f7 f6 ]
    const __m256i coeffs_67 = yy_set_m128i(coeffs_67_128, coeffs_67_128);

    const __m256i round_const =
        _mm256_set1_epi32((1 << (conv_params->round_1 - 1)) -
                          (1 << (bd + conv_params->round_1 - 1)));

    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; j += 16) {
        const uint16_t *temp_ij = temp + i * MAX_SB_SIZE + j;

        // Load 16-bit data from the output of the horizontal filter in
        // which the pixels are ordered as follows:
        // [ 15 13 11 9 14 12 10 8 ] [ 7 5 3 1 6 4 2 0 ]
        const __m256i data_0 = yy_loadu_256(temp_ij + 0 * MAX_SB_SIZE);
        const __m256i data_1 = yy_loadu_256(temp_ij + 1 * MAX_SB_SIZE);
        const __m256i data_2 = yy_loadu_256(temp_ij + 2 * MAX_SB_SIZE);
        const __m256i data_3 = yy_loadu_256(temp_ij + 3 * MAX_SB_SIZE);
        const __m256i data_4 = yy_loadu_256(temp_ij + 4 * MAX_SB_SIZE);
        const __m256i data_5 = yy_loadu_256(temp_ij + 5 * MAX_SB_SIZE);
        const __m256i data_6 = yy_loadu_256(temp_ij + 6 * MAX_SB_SIZE);
        const __m256i data_7 = yy_loadu_256(temp_ij + 7 * MAX_SB_SIZE);

        // Filter the even-indices, increasing to 32-bit precision
        const __m256i src_0 = _mm256_unpacklo_epi16(data_0, data_1);
        const __m256i src_2 = _mm256_unpacklo_epi16(data_2, data_3);
        const __m256i src_4 = _mm256_unpacklo_epi16(data_4, data_5);
        const __m256i src_6 = _mm256_unpacklo_epi16(data_6, data_7);

        const __m256i res_0 = _mm256_madd_epi16(src_0, coeffs_01);
        const __m256i res_2 = _mm256_madd_epi16(src_2, coeffs_23);
        const __m256i res_4 = _mm256_madd_epi16(src_4, coeffs_45);
        const __m256i res_6 = _mm256_madd_epi16(src_6, coeffs_67);

        const __m256i res_even = _mm256_add_epi32(
            _mm256_add_epi32(res_0, res_2), _mm256_add_epi32(res_4, res_6));

        // Filter the odd-indices, increasing to 32-bit precision
        const __m256i src_1 = _mm256_unpackhi_epi16(data_0, data_1);
        const __m256i src_3 = _mm256_unpackhi_epi16(data_2, data_3);
        const __m256i src_5 = _mm256_unpackhi_epi16(data_4, data_5);
        const __m256i src_7 = _mm256_unpackhi_epi16(data_6, data_7);

        const __m256i res_1 = _mm256_madd_epi16(src_1, coeffs_01);
        const __m256i res_3 = _mm256_madd_epi16(src_3, coeffs_23);
        const __m256i res_5 = _mm256_madd_epi16(src_5, coeffs_45);
        const __m256i res_7 = _mm256_madd_epi16(src_7, coeffs_67);

        const __m256i res_odd = _mm256_add_epi32(
            _mm256_add_epi32(res_1, res_3), _mm256_add_epi32(res_5, res_7));

        // Pixels are currently in the following order:
        // res_even order: [ 14 12 10 8 ] [ 6 4 2 0 ]
        // res_odd order:  [ 15 13 11 9 ] [ 7 5 3 1 ]
        //
        // Rearrange the pixels into the following order:
        // res_lo order: [ 11 10  9  8 ] [ 3 2 1 0 ]
        // res_hi order: [ 15 14 13 12 ] [ 7 6 5 4 ]
        const __m256i res_lo = _mm256_unpacklo_epi32(res_even, res_odd);
        const __m256i res_hi = _mm256_unpackhi_epi32(res_even, res_odd);

        const __m256i res_lo_round = _mm256_srai_epi32(
            _mm256_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m256i res_hi_round = _mm256_srai_epi32(
            _mm256_add_epi32(res_hi, round_const), conv_params->round_1);

        // Reduce to 16-bit precision and pack into the correct order:
        // [ 15 14 13 12 11 10 9 8 ][ 7 6 5 4 3 2 1 0 ]
        const __m256i res_16bit =
            _mm256_packs_epi32(res_lo_round, res_hi_round);
        const __m256i res_16bit_clamped = _mm256_min_epi16(
            _mm256_max_epi16(res_16bit, clamp_low), clamp_high);

        // Store in the dst array
        yy_storeu_256(dst + i * dst_stride + j, res_16bit_clamped);
      }
    }
  }
}